

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O2

QString * __thiscall
QXcbScreen::getOutputName
          (QString *__return_storage_ptr__,QXcbScreen *this,
          xcb_randr_get_output_info_reply_t *outputInfo)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  char *utf8;
  long in_FS_OFFSET;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  if (outputInfo == (xcb_randr_get_output_info_reply_t *)0x0) {
    defaultName((QString *)&local_38,this);
  }
  else {
    utf8 = (char *)xcb_randr_get_output_info_name(outputInfo);
    iVar4 = xcb_randr_get_output_info_name_length(outputInfo);
    QString::fromUtf8((QString *)&local_38,utf8,(long)iVar4);
  }
  qVar3 = local_38.size;
  pcVar2 = local_38.ptr;
  pDVar1 = local_38.d;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  local_48 = SUB84(pDVar1,0);
  uStack_44 = (undefined4)((ulong)pDVar1 >> 0x20);
  uStack_40 = SUB84(pcVar2,0);
  uStack_3c = (undefined4)((ulong)pcVar2 >> 0x20);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_48;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uStack_44;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uStack_40;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_3c;
  (__return_storage_ptr__->d).size = qVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QXcbScreen::getOutputName(xcb_randr_get_output_info_reply_t *outputInfo)
{
    QString name;
    if (outputInfo) {
        name = QString::fromUtf8((const char*)xcb_randr_get_output_info_name(outputInfo),
                                 xcb_randr_get_output_info_name_length(outputInfo));
    } else {
        name = defaultName();
    }
    return name;
}